

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMeshGetDomainsByName(FmsMesh mesh,char *domain_name,FmsInt *num_domains,FmsDomain **domains)

{
  FmsInt FVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  FmsInt FVar5;
  
  if (mesh == (FmsMesh)0x0) {
    iVar4 = 1;
  }
  else if (domain_name == (char *)0x0) {
    iVar4 = 2;
  }
  else {
    FVar1 = mesh->num_domain_names;
    iVar4 = 4;
    if (FVar1 != 0) {
      ppcVar2 = mesh->domain_names;
      FVar5 = 0;
      do {
        iVar3 = strcmp(domain_name,ppcVar2[FVar5]);
        if (iVar3 == 0) {
          if (num_domains != (FmsInt *)0x0) {
            *num_domains = mesh->domain_offsets[FVar5 + 1] - mesh->domain_offsets[FVar5];
          }
          if (domains == (FmsDomain **)0x0) {
            return 0;
          }
          *domains = mesh->domains + mesh->domain_offsets[FVar5];
          return 0;
        }
        FVar5 = FVar5 + 1;
      } while (FVar1 != FVar5);
    }
  }
  return iVar4;
}

Assistant:

int FmsMeshGetDomainsByName(FmsMesh mesh, const char *domain_name,
                            FmsInt *num_domains, FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (!domain_name) { E_RETURN(2); }
  const FmsInt num_domain_names = mesh->num_domain_names;
  char **domain_names = mesh->domain_names;
  FmsInt domain_name_id = 0;
  for ( ; 1; domain_name_id++) {
    if (domain_name_id == num_domain_names) { E_RETURN(4); }
    if (strcmp(domain_name, domain_names[domain_name_id]) == 0) { break; }
  }
  if (num_domains) {
    *num_domains = mesh->domain_offsets[domain_name_id+1] -
                   mesh->domain_offsets[domain_name_id];
  }
  if (domains) {
    *domains = mesh->domains + mesh->domain_offsets[domain_name_id];
  }
  return 0;
}